

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::precisionQualifierCheck
          (TParseContext *this,TSourceLoc *loc,TBasicType baseType,TQualifier *qualifier,
          bool isCoopMatOrVec)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  EShMessages EVar4;
  
  if (((this->precisionManager).obey == true) &&
     ((this->super_TParseContextBase).parsingBuiltins == false)) {
    if ((baseType == EbtAtomicUint) &&
       ((uVar1 = *(uint *)&qualifier->field_0x8 >> 0x19 & 7, uVar1 != 0 && (uVar1 != 3)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"atomic counters can only be highp","atomic_uint","");
    }
    if (!isCoopMatOrVec) {
      if ((baseType < EbtStruct) && ((0x6302U >> (baseType & (EbtNumTypes|EbtFloat16)) & 1) != 0)) {
        if ((qualifier->field_0xb & 0xe) == 0) {
          EVar4 = (this->super_TParseContextBase).super_TParseVersions.messages &
                  EShMsgRelaxedErrors;
          pcVar2 = TType::getBasicString(baseType);
          pcVar3 = "substituting \'mediump\'";
          if (EVar4 == EShMsgDefault) {
            pcVar3 = "";
          }
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [(ulong)EVar4 + 0x2d])
                    (this,loc,"type requires declaration of default precision qualifier",pcVar2,
                     pcVar3);
          *(ulong *)&qualifier->field_0x8 =
               *(ulong *)&qualifier->field_0x8 & 0xfffffffff1ffffff | 0x4000000;
          this->defaultPrecision[baseType] = EpqMedium;
        }
      }
      else if ((qualifier->field_0xb & 0xe) != 0) {
        pcVar2 = TType::getBasicString(baseType);
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        (*UNRECOVERED_JUMPTABLE)
                  (this,loc,"type cannot have precision qualifier",pcVar2,"",UNRECOVERED_JUMPTABLE);
        return;
      }
    }
  }
  return;
}

Assistant:

void TParseContext::precisionQualifierCheck(const TSourceLoc& loc, TBasicType baseType, TQualifier& qualifier, bool isCoopMatOrVec)
{
    // Built-in symbols are allowed some ambiguous precisions, to be pinned down
    // later by context.
    if (! obeyPrecisionQualifiers() || parsingBuiltins)
        return;

    if (baseType == EbtAtomicUint && qualifier.precision != EpqNone && qualifier.precision != EpqHigh)
        error(loc, "atomic counters can only be highp", "atomic_uint", "");

    if (isCoopMatOrVec)
        return;

    if (baseType == EbtFloat || baseType == EbtUint || baseType == EbtInt || baseType == EbtSampler || baseType == EbtAtomicUint) {
        if (qualifier.precision == EpqNone) {
            if (relaxedErrors())
                warn(loc, "type requires declaration of default precision qualifier", TType::getBasicString(baseType), "substituting 'mediump'");
            else
                error(loc, "type requires declaration of default precision qualifier", TType::getBasicString(baseType), "");
            qualifier.precision = EpqMedium;
            defaultPrecision[baseType] = EpqMedium;
        }
    } else if (qualifier.precision != EpqNone)
        error(loc, "type cannot have precision qualifier", TType::getBasicString(baseType), "");
}